

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

void CommandLine_Define(KonohaContext *kctx,char *keyvalue,KTraceInfo *trace)

{
  KonohaLib *pKVar1;
  _func_ksymbol_t_KonohaContext_ptr_char_ptr_size_t_int_ksymbol_t *p_Var2;
  _func_kbool_t_KonohaContext_ptr_kNameSpace_ptr_ksymbol_t_ktypeattr_t_uintptr_t_KTraceInfo_ptr
  *p_Var3;
  KClass *pKVar4;
  _func_kObject_ptr_KonohaContext_ptr_KClass_ptr *p_Var5;
  undefined8 uVar6;
  long lVar7;
  KTraceInfo *pKVar8;
  ksymbol_t kVar9;
  char *pcVar10;
  ushort **ppuVar11;
  kNameSpace *pkVar12;
  ktypeattr_t kVar13;
  char *__dest;
  size_t __n;
  undefined8 uStack_50;
  char acStack_48 [8];
  KTraceInfo *local_40;
  char *local_38;
  
  uStack_50 = 0x103f7e;
  pcVar10 = strchr(keyvalue,0x3d);
  if (pcVar10 != (char *)0x0) {
    __n = (long)pcVar10 - (long)keyvalue;
    lVar7 = -(__n + 0x10 & 0xfffffffffffffff0);
    __dest = acStack_48 + lVar7;
    local_40 = trace;
    local_38 = pcVar10;
    *(undefined8 *)((long)&uStack_50 + lVar7) = 0x103fb7;
    memcpy(__dest,keyvalue,__n);
    __dest[__n] = '\0';
    pKVar1 = kctx->klib;
    kVar13 = 0;
    *(undefined8 *)((long)&uStack_50 + lVar7) = 0xfffffffffffffffe;
    uVar6 = *(undefined8 *)((long)&uStack_50 + lVar7);
    p_Var2 = pKVar1->Ksymbol;
    *(undefined8 *)((long)&uStack_50 + lVar7) = 0x103fd8;
    kVar9 = (*p_Var2)(kctx,__dest,__n,0,(ksymbol_t)uVar6);
    *(undefined8 *)((long)&uStack_50 + lVar7) = 0x103fe0;
    ppuVar11 = __ctype_b_loc();
    pcVar10 = pcVar10 + 1;
    if ((*(byte *)((long)*ppuVar11 + (long)local_38[1] * 2 + 1) & 8) != 0) {
      *(undefined8 *)((long)&uStack_50 + lVar7) = 0x104002;
      pcVar10 = (char *)strtol(pcVar10,(char **)0x0,0);
      *(undefined8 *)((long)&uStack_50 + lVar7) = 4;
      kVar13 = (ktypeattr_t)*(undefined8 *)((long)&uStack_50 + lVar7);
    }
    p_Var3 = kctx->klib->kNameSpace_SetConstData;
    pKVar4 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
    p_Var5 = kctx->klib->Knull;
    *(undefined8 *)((long)&uStack_50 + lVar7) = 0x104029;
    pkVar12 = (kNameSpace *)(*p_Var5)(kctx,pKVar4);
    pKVar8 = local_40;
    *(undefined8 *)((long)&uStack_50 + lVar7) = 0x10403f;
    (*p_Var3)(kctx,pkVar12,kVar9,kVar13,(uintptr_t)pcVar10,pKVar8);
    return;
  }
  uStack_50 = 0x10406a;
  fwrite("invalid define option: use -D<key>=<value>\n",0x2b,1,_stdout);
  uStack_50 = 0x4e;
  (*kctx->platApi->exit_i)
            (1,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/exec/command/command.c"
             ,0x4e);
  return;
}

Assistant:

static void CommandLine_Define(KonohaContext *kctx, char *keyvalue, KTraceInfo *trace)
{
	char *p = strchr(keyvalue, '=');
	if(p != NULL) {
		size_t len = p-keyvalue;
		char *namebuf = ALLOCA(char, len+1);
		memcpy(namebuf, keyvalue, len); namebuf[len] = 0;
//		DBG_P("name='%s'", namebuf);
		ksymbol_t key = KLIB Ksymbol(kctx, namebuf, len, 0, KSymbol_NewId);
		uintptr_t unboxValue;
		ktypeattr_t ty;
		if(isdigit(p[1])) {
			ty = KType_Int;
			unboxValue = (uintptr_t)strtol(p+1, NULL, 0);
		}
		else {
			ty = VirtualType_Text;
			unboxValue = (uintptr_t)(p+1);
		}
		KLIB kNameSpace_SetConstData(kctx, KNULL(NameSpace), key, ty, unboxValue, trace);
	}
	else {
		fprintf(stdout, "invalid define option: use -D<key>=<value>\n");
		KExit(EXIT_FAILURE);
	}
}